

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::PrintResultError
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *values,idx_t expected_column_count,bool row_wise)

{
  byte in_R8B;
  string *in_stack_ffffffffffffff60;
  string *header;
  allocator<char> local_81;
  string local_80 [15];
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 in_stack_ffffffffffffff90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff98;
  SQLLogicTestLogger *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [39];
  byte local_21;
  
  local_21 = in_R8B & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Expected result:",&local_49);
  PrintHeader(in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  PrintLineSep();
  PrintExpectedResult(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      (bool)in_stack_ffffffffffffff8f);
  PrintLineSep();
  header = (string *)&local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Actual result:",(allocator *)header);
  PrintHeader(header);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::PrintResultError(MaterializedQueryResult &result, const vector<string> &values,
                                          idx_t expected_column_count, bool row_wise) {
	PrintHeader("Expected result:");
	PrintLineSep();
	PrintExpectedResult(values, expected_column_count, row_wise);
	PrintLineSep();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}